

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O0

int sp_symetree(int *acolst,int *acolend,int *arow,int n,int *parent)

{
  int *local_58;
  int *pp;
  int p;
  int rroot;
  int col;
  int row;
  int cset;
  int rset;
  int *root;
  int *parent_local;
  int *piStack_20;
  int n_local;
  int *arow_local;
  int *acolend_local;
  int *acolst_local;
  
  root = parent;
  parent_local._4_4_ = n;
  piStack_20 = arow;
  arow_local = acolend;
  acolend_local = acolst;
  _cset = mxCallocInt(n);
  initialize_disjoint_sets(parent_local._4_4_,&local_58);
  for (p = 0; p < parent_local._4_4_; p = p + 1) {
    col = make_set(p,local_58);
    _cset[col] = p;
    root[p] = parent_local._4_4_;
    for (pp._0_4_ = acolend_local[p]; (int)pp < arow_local[p]; pp._0_4_ = (int)pp + 1) {
      rroot = piStack_20[(int)pp];
      if (rroot < p) {
        row = find(rroot,local_58);
        pp._4_4_ = _cset[row];
        if (pp._4_4_ != p) {
          root[pp._4_4_] = p;
          col = link((char *)(ulong)(uint)col,(char *)(ulong)(uint)row);
          _cset[col] = p;
        }
      }
    }
  }
  superlu_free(_cset);
  finalize_disjoint_sets(local_58);
  return 0;
}

Assistant:

int sp_symetree(
                const int *acolst, const int *acolend, /* column starts and ends past 1 */
                const int *arow,            /* row indices of A */
                int n,                /* dimension of A */
                int *parent)    /* parent in elim tree */
{
	int	*root;		    /* root of subtree of etree 	*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (n);
	initialize_disjoint_sets (n, &pp);

	for (col = 0; col < n; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = n; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}
	SUPERLU_FREE (root);
	finalize_disjoint_sets (pp);
	return 0;
}